

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O0

Info * __thiscall EOPlus::Parser::ParseMainBlock(Info *__return_storage_ptr__,Parser *this)

{
  bool bVar1;
  int line_;
  Parser_Error *this_00;
  pointer pPVar2;
  Token *t_00;
  bool local_1e2;
  Token local_1b8;
  string local_168;
  allocator<char> local_141;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  byte local_d9;
  string local_d8;
  variant local_a8;
  undefined1 local_68 [8];
  Token t;
  Parser *this_local;
  
  t._72_8_ = this;
  util::variant::variant(&local_a8);
  Token::Token((Token *)local_68,Invalid,&local_a8);
  util::variant::~variant(&local_a8);
  local_d9 = 0;
  bVar1 = GetToken(this,(Token *)local_68,0x40);
  local_1e2 = false;
  if (bVar1) {
    util::variant::operator_cast_to_string(&local_d8,(variant *)&t);
    local_d9 = 1;
    local_1e2 = std::operator==(&local_d8,"{");
  }
  if ((local_d9 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_d8);
  }
  if (local_1e2 != false) {
    ParseMain(__return_storage_ptr__,this);
    Token::~Token((Token *)local_68);
    return __return_storage_ptr__;
  }
  this_00 = (Parser_Error *)__cxa_allocate_exception(0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"Expected opening brace \'{\' after \'main\'.",&local_141);
  std::operator+(&local_120,&local_140," Got: ");
  pPVar2 = std::
           unique_ptr<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
           ::operator->(&this->tok);
  Parser_Token_Server_Base::RejectToken(&local_1b8,pPVar2);
  token_got_string_abi_cxx11_(&local_168,(EOPlus *)&local_1b8,t_00);
  std::operator+(&local_100,&local_120,&local_168);
  pPVar2 = std::
           unique_ptr<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
           ::operator->(&this->tok);
  line_ = Parser_Token_Server_Base::RejectLine(pPVar2);
  Parser_Error::Parser_Error(this_00,&local_100,line_);
  __cxa_throw(this_00,&Parser_Error::typeinfo,Parser_Error::~Parser_Error);
}

Assistant:

Info Parser::ParseMainBlock()
	{
		Token t;

		if (this->GetToken(t, Token::Symbol) && std::string(t.data) == "{")
			return ParseMain();

		PARSER_ERROR_GOT("Expected opening brace '{' after 'main'.");
	}